

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg5U
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,RegSlot R4,
          uint slotIndex)

{
  code *pcVar1;
  RegSlot R3_00;
  OpCode op_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot RVar3;
  RegSlot R4_00;
  undefined4 *puVar4;
  undefined6 in_register_00000032;
  FunctionBody *pFVar5;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  uint local_44;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  uint local_34;
  
  local_3c = R2;
  local_38 = R3;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x9);
  local_34 = (uint)CONCAT62(in_register_00000032,op);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x23a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088da1d;
    *puVar4 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar5 = this->m_functionWrite;
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088da1d;
      *puVar4 = 0;
      pFVar5 = this->m_functionWrite;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar5,R0);
    if (R1 != 0xffffffff) {
      pFVar5 = this->m_functionWrite;
      if (pFVar5 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0088da1d;
        *puVar4 = 0;
        pFVar5 = this->m_functionWrite;
      }
      R1_00 = FunctionBody::MapRegSlot(pFVar5,R1);
      RVar3 = local_3c;
      if (local_3c != 0xffffffff) {
        pFVar5 = this->m_functionWrite;
        if (pFVar5 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar2) goto LAB_0088da1d;
          *puVar4 = 0;
          pFVar5 = this->m_functionWrite;
        }
        local_3c = FunctionBody::MapRegSlot(pFVar5,RVar3);
        RVar3 = local_38;
        if (local_38 != 0xffffffff) {
          pFVar5 = this->m_functionWrite;
          if (pFVar5 == (FunctionBody *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
            if (!bVar2) goto LAB_0088da1d;
            *puVar4 = 0;
            pFVar5 = this->m_functionWrite;
          }
          RVar3 = FunctionBody::MapRegSlot(pFVar5,RVar3);
          if (R4 != 0xffffffff) {
            pFVar5 = this->m_functionWrite;
            local_38 = RVar3;
            if (pFVar5 != (FunctionBody *)0x0) {
LAB_0088d915:
              R4_00 = FunctionBody::MapRegSlot(pFVar5,R4);
              R3_00 = local_38;
              RVar3 = local_3c;
              op_00 = (OpCode)local_34;
              local_34 = local_34 & 0xffff;
              local_40 = R0_00;
              bVar2 = TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                                (this,op_00,R0_00,R1_00,local_3c,local_38,R4_00,slotIndex);
              if (!bVar2) {
                bVar2 = TryWriteReg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                                  (this,(OpCode)local_34,local_40,R1_00,RVar3,R3_00,R4_00,slotIndex)
                ;
                if (!bVar2) {
                  local_58 = local_40;
                  local_50 = RVar3;
                  local_4c = R3_00;
                  local_44 = slotIndex;
                  local_54 = R1_00;
                  local_48 = R4_00;
                  Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
                  Data::Write(&this->m_byteCodeData,&local_58,0x18);
                }
              }
              return;
            }
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
            if (bVar2) {
              *puVar4 = 0;
              pFVar5 = this->m_functionWrite;
              goto LAB_0088d915;
            }
            goto LAB_0088da1d;
          }
        }
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_0088da1d:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg5U(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, uint slotIndex)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg5U);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);
        R3 = ConsumeReg(R3);
        R4 = ConsumeReg(R4);

        MULTISIZE_LAYOUT_WRITE(Reg5U, op, R0, R1, R2, R3, R4, slotIndex);
    }